

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O0

void __thiscall
chaiscript::dispatch::Dynamic_Proxy_Function::Dynamic_Proxy_Function
          (Dynamic_Proxy_Function *this,int t_arity,shared_ptr<chaiscript::AST_Node> *t_parsenode,
          Param_Types *t_param_types,Proxy_Function *t_guard)

{
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> local_48;
  Proxy_Function *local_30;
  Proxy_Function *t_guard_local;
  Param_Types *t_param_types_local;
  shared_ptr<chaiscript::AST_Node> *t_parsenode_local;
  Dynamic_Proxy_Function *pDStack_10;
  int t_arity_local;
  Dynamic_Proxy_Function *this_local;
  
  local_30 = t_guard;
  t_guard_local = (Proxy_Function *)t_param_types;
  t_param_types_local = (Param_Types *)t_parsenode;
  t_parsenode_local._4_4_ = t_arity;
  pDStack_10 = this;
  build_param_type_list(&local_48,t_param_types);
  Proxy_Function_Base::Proxy_Function_Base
            (&this->super_Proxy_Function_Base,&local_48,t_parsenode_local._4_4_);
  std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::~vector(&local_48);
  (this->super_Proxy_Function_Base)._vptr_Proxy_Function_Base =
       (_func_int **)&PTR__Dynamic_Proxy_Function_0087b688;
  Param_Types::Param_Types(&this->m_param_types,t_param_types);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::shared_ptr(&this->m_guard,t_guard);
  std::shared_ptr<chaiscript::AST_Node>::shared_ptr(&this->m_parsenode,t_parsenode);
  return;
}

Assistant:

Dynamic_Proxy_Function(const int t_arity,
                             std::shared_ptr<AST_Node> t_parsenode,
                             Param_Types t_param_types = Param_Types(),
                             Proxy_Function t_guard = Proxy_Function())
          : Proxy_Function_Base(build_param_type_list(t_param_types), t_arity)
          , m_param_types(std::move(t_param_types))
          , m_guard(std::move(t_guard))
          , m_parsenode(std::move(t_parsenode)) {
        // assert(t_parsenode);
      }